

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AdamOptimizer * __thiscall CoreML::Specification::Optimizer::mutable_adamoptimizer(Optimizer *this)

{
  bool bVar1;
  AdamOptimizer *this_00;
  Optimizer *this_local;
  
  bVar1 = has_adamoptimizer(this);
  if (!bVar1) {
    clear_OptimizerType(this);
    set_has_adamoptimizer(this);
    this_00 = (AdamOptimizer *)operator_new(0x40);
    AdamOptimizer::AdamOptimizer(this_00);
    (this->OptimizerType_).adamoptimizer_ = this_00;
  }
  return (AdamOptimizer *)(this->OptimizerType_).sgdoptimizer_;
}

Assistant:

inline ::CoreML::Specification::AdamOptimizer* Optimizer::mutable_adamoptimizer() {
  if (!has_adamoptimizer()) {
    clear_OptimizerType();
    set_has_adamoptimizer();
    OptimizerType_.adamoptimizer_ = new ::CoreML::Specification::AdamOptimizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Optimizer.adamOptimizer)
  return OptimizerType_.adamoptimizer_;
}